

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeTabBar(ImGuiTabBar *tab_bar,char *label)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabItem *tab;
  int iVar2;
  uint uVar3;
  ImGuiTabItem *pIVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ImDrawList *this;
  char *pcVar12;
  int tab_n;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ImVec2 local_148;
  ImVec2 local_140;
  char buf [256];
  undefined1 local_38 [8];
  
  iVar2 = tab_bar->PrevFrameVisible;
  iVar8 = GImGui->FrameCount + -2;
  pcVar11 = " *Inactive*";
  if (iVar8 <= iVar2) {
    pcVar11 = "";
  }
  iVar9 = ImFormatString(buf,0x100,"%s 0x%08X (%d tabs)%s",label,(ulong)tab_bar->ID,
                         (ulong)(uint)(tab_bar->Tabs).Size,pcVar11);
  iVar10 = ImFormatString(buf + iVar9,0x100 - (long)iVar9,"  { ");
  pcVar11 = buf + iVar9 + iVar10;
  lVar15 = 0;
  lVar13 = 0;
  while( true ) {
    iVar9 = (tab_bar->Tabs).Size;
    iVar10 = 3;
    if (iVar9 < 3) {
      iVar10 = iVar9;
    }
    if (iVar10 <= lVar13) break;
    pcVar12 = ", ";
    if (lVar15 == 0) {
      pcVar12 = "";
    }
    iVar9 = ImFormatString(pcVar11,(size_t)(local_38 + -(long)pcVar11),"%s\'%s\'",pcVar12);
    pcVar11 = pcVar11 + iVar9;
    lVar13 = lVar13 + 1;
    lVar15 = lVar15 + 0x28;
  }
  pcVar12 = " } ";
  if (3 < iVar9) {
    pcVar12 = " ... }";
  }
  ImFormatString(pcVar11,(size_t)(local_38 + -(long)pcVar11),pcVar12);
  if (iVar2 < iVar8) {
    PushStyleColor(0,(GImGui->Style).Colors + 1);
  }
  bVar6 = TreeNode(label,"%s",buf);
  if (iVar2 < iVar8) {
    PopStyleColor(1);
  }
  else {
    bVar7 = IsItemHovered(0);
    if (bVar7) {
      this = GetForegroundDrawList();
      ImDrawList::AddRect(this,&(tab_bar->BarRect).Min,&(tab_bar->BarRect).Max,0xff00ffff,0.0,0,1.0)
      ;
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMinX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
      local_140.y = (tab_bar->BarRect).Min.y;
      local_148.x = tab_bar->ScrollingRectMaxX;
      local_148.y = (tab_bar->BarRect).Max.y;
      local_140.x = local_148.x;
      ImDrawList::AddLine(this,&local_140,&local_148,0xff00ff00,1.0);
    }
  }
  if (bVar6) {
    lVar13 = 0;
    for (uVar14 = 0; (long)uVar14 < (long)(tab_bar->Tabs).Size; uVar14 = uVar14 + 1) {
      pIVar4 = (tab_bar->Tabs).Data;
      tab = (ImGuiTabItem *)((long)&pIVar4->ID + lVar13);
      PushID(tab);
      bVar6 = SmallButton("<");
      if (bVar6) {
        TabBarQueueReorder(tab_bar,tab,-1);
      }
      SameLine(0.0,2.0);
      bVar6 = SmallButton(">");
      if (bVar6) {
        TabBarQueueReorder(tab_bar,tab,1);
      }
      SameLine(0.0,-1.0);
      uVar3 = *(uint *)((long)&pIVar4->ID + lVar13);
      uVar5 = 0x20;
      if (uVar3 == tab_bar->SelectedTabId) {
        uVar5 = 0x2a;
      }
      lVar15 = (long)*(int *)((long)&pIVar4->NameOffset + lVar13);
      pcVar11 = "???";
      if (lVar15 != -1) {
        pcVar11 = (tab_bar->TabsNames).Buf.Data + lVar15;
      }
      Text("%02d%c Tab 0x%08X \'%s\' Offset: %.1f, Width: %.1f/%.1f",
           (double)*(float *)((long)&pIVar4->Offset + lVar13),
           (double)*(float *)((long)&pIVar4->Width + lVar13),
           (double)*(float *)((long)&pIVar4->ContentWidth + lVar13),uVar14 & 0xffffffff,uVar5,
           (ulong)uVar3,pcVar11);
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      lVar13 = lVar13 + 0x28;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTabBar(ImGuiTabBar* tab_bar, const char* label)
{
    // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
    char buf[256];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (tab_bar->PrevFrameVisible >= GetFrameCount() - 2);
    p += ImFormatString(p, buf_end - p, "%s 0x%08X (%d tabs)%s", label, tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
    p += ImFormatString(p, buf_end - p, "  { ");
    for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        p += ImFormatString(p, buf_end - p, "%s'%s'",
            tab_n > 0 ? ", " : "", (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
    }
    p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(label, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (is_active && IsItemHovered())
    {
        ImDrawList* draw_list = GetForegroundDrawList();
        draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
        draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
    }
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            PushID(tab);
            if (SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } SameLine(0, 2);
            if (SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } SameLine();
            Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
            PopID();
        }
        TreePop();
    }
}